

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O3

ParameterError set_rate(GlobalConfig *global,char *nextarg)

{
  byte bVar1;
  undefined1 auVar2 [16];
  ParameterError PVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  size_t __n;
  curl_off_t numunits;
  long denominator;
  char number [26];
  curl_off_t local_70;
  long local_68;
  byte *local_60;
  char local_58 [40];
  
  pcVar5 = strchr(nextarg,0x2f);
  if (pcVar5 == (char *)0x0) {
    __n = strlen(nextarg);
  }
  else {
    __n = (long)pcVar5 - (long)nextarg;
  }
  if (0x19 < __n) {
    return PARAM_NUMBER_TOO_LARGE;
  }
  memcpy(local_58,nextarg,__n);
  local_58[__n] = '\0';
  PVar3 = str2unum(&local_68,local_58);
  if (PVar3 != PARAM_OK) {
    return PVar3;
  }
  if (local_68 < 1) {
    return PARAM_BAD_USE;
  }
  if (pcVar5 == (char *)0x0) {
    lVar6 = 3600000;
LAB_00111f0f:
    PVar3 = PARAM_NUMBER_TOO_LARGE;
    if (local_68 <= lVar6) {
      global->ms_per_transfer = lVar6 / local_68;
      PVar3 = PARAM_OK;
    }
  }
  else {
    local_60 = (byte *)(pcVar5 + 1);
    iVar4 = Curl_str_number((char **)&local_60,&local_70,0x7fffffffffffffff);
    if (iVar4 != 0) {
      local_70 = 1;
    }
    bVar1 = *local_60;
    if (bVar1 < 0x6d) {
      if (bVar1 == 100) {
        uVar7 = 86400000;
        goto LAB_00111ecf;
      }
      uVar7 = 3600000;
      if (bVar1 == 0x68) goto LAB_00111ecf;
LAB_00111e9b:
      errorf(global,"unsupported --rate unit");
      if (local_70 < 0x25485f2c3f0) {
        return PARAM_BAD_USE;
      }
    }
    else {
      if (bVar1 == 0x6d) {
        uVar7 = 60000;
      }
      else {
        if (bVar1 != 0x73) goto LAB_00111e9b;
        uVar7 = 1000;
      }
LAB_00111ecf:
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar7;
      if (local_70 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar2,0)) {
        lVar6 = local_70 * uVar7;
        goto LAB_00111f0f;
      }
    }
    errorf(global,"too large --rate unit");
    PVar3 = PARAM_NUMBER_TOO_LARGE;
  }
  return PVar3;
}

Assistant:

static ParameterError set_rate(struct GlobalConfig *global,
                               const char *nextarg)
{
  /* --rate */
  /* support a few different suffixes, extract the suffix first, then
     get the number and convert to per hour.
     /s == per second
     /m == per minute
     /h == per hour (default)
     /d == per day (24 hours)
  */
  ParameterError err = PARAM_OK;
  const char *div = strchr(nextarg, '/');
  char number[26];
  long denominator;
  long numerator = 60*60*1000; /* default per hour */
  size_t numlen = div ? (size_t)(div - nextarg) : strlen(nextarg);
  if(numlen > sizeof(number) -1)
    return PARAM_NUMBER_TOO_LARGE;

  memcpy(number, nextarg, numlen);
  number[numlen] = 0;
  err = str2unum(&denominator, number);
  if(err)
    return err;

  if(denominator < 1)
    return PARAM_BAD_USE;

  if(div) {
    curl_off_t numunits;
    div++;

    if(curlx_str_number(&div, &numunits, CURL_OFF_T_MAX))
      numunits = 1;

    switch(*div) {
    case 's': /* per second */
      numerator = 1000;
      break;
    case 'm': /* per minute */
      numerator = 60*1000;
      break;
    case 'h': /* per hour */
      break;
    case 'd': /* per day */
      numerator = 24*60*60*1000;
      break;
    default:
      errorf(global, "unsupported --rate unit");
      err = PARAM_BAD_USE;
      break;
    }

    if((LONG_MAX / numerator) < numunits) {
      /* overflow, too large number */
      errorf(global, "too large --rate unit");
      err = PARAM_NUMBER_TOO_LARGE;
    }
    /* this typecast is okay based on the check above */
    numerator *= (long)numunits;
  }

  if(err)
    ;
  else if(denominator > numerator)
    err = PARAM_NUMBER_TOO_LARGE;
  else
    global->ms_per_transfer = numerator/denominator;

  return err;
}